

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,GlobalVariable *var,bool decl)

{
  bool bVar1;
  uint uVar2;
  Type *pTVar3;
  PointerType *this_00;
  undefined7 in_register_00000011;
  Constant *local_18;
  
  if ((int)CONCAT71(in_register_00000011,decl) == 0) {
    local_18 = (Constant *)Value::get_tween_id((Value *)var);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1a78d7,(unsigned_long *)&local_18);
  }
  else {
    local_18 = (Constant *)Value::get_tween_id((Value *)var);
    append<char_const(&)[2],unsigned_long,char_const(&)[4]>
              (this,(char (*) [2])0x1a78d7,(unsigned_long *)&local_18,(char (*) [4])" = ");
    pTVar3 = Value::getType((Value *)var);
    this_00 = cast<LLVMBC::PointerType>(pTVar3);
    uVar2 = Type::getAddressSpace(&this_00->super_Type);
    if (uVar2 == 0) {
      bVar1 = GlobalVariable::isConstant(var);
      local_18 = (Constant *)0x1a78f3;
      if (bVar1) {
        local_18 = (Constant *)0x1a78ea;
      }
      append<char_const*,char_const(&)[2]>(this,(char **)&local_18,(char (*) [2])0x1a77b6);
    }
    else {
      std::operator<<((ostream *)this,"groupshared ");
    }
    pTVar3 = Value::getType((Value *)var);
    pTVar3 = Type::getPointerElementType(pTVar3);
    append(this,pTVar3);
    bVar1 = GlobalVariable::hasInitializer(var);
    if (bVar1) {
      local_18 = GlobalVariable::getInitializer(var);
      append<char_const(&)[2],LLVMBC::Constant*>(this,(char (*) [2])0x1a77b6,&local_18);
    }
    newline(this);
  }
  return;
}

Assistant:

void StreamState::append(GlobalVariable *var, bool decl)
{
	if (decl)
	{
		append("@", var->get_tween_id(), " = ");

		if (cast<PointerType>(var->getType())->getAddressSpace() != 0)
			append("groupshared ");
		else
			append(var->isConstant() ? "constant" : "global", " ");
		append(var->getType()->getPointerElementType());

		if (var->hasInitializer())
			append(" ", var->getInitializer());
		newline();
	}
	else
	{
		append("@", var->get_tween_id());
	}
}